

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  InstNode IVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  byte *pbVar6;
  undefined8 uVar7;
  bool bVar8;
  uint32_t uVar9;
  int iVar10;
  Error EVar11;
  Operand *pOVar12;
  Operand *pOVar13;
  VirtReg **ppVVar14;
  uint uVar15;
  long lVar16;
  undefined4 uVar17;
  InstNode *this_00;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  BitWordIterator<unsigned_int> outIt;
  BitWordIterator<unsigned_int> useIt;
  
  uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                    _logger;
  do {
    while( true ) {
      do {
        this_00 = (InstNode *)first;
        if (this_00 == (InstNode *)stop) {
          return 0;
        }
        first = *(BaseNode **)(this_00 + 8);
      } while (((byte)this_00[0x11] & 0x20) == 0);
      plVar5 = *(long **)(this_00 + 0x20);
      IVar1 = this_00[0x12];
      if (plVar5 != (long *)0x0) break;
LAB_0014561e:
      for (lVar16 = 0; (ulong)(byte)IVar1 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
        if ((*(uint *)(this_00 + lVar16 + 0x40) & 0x2007) == 0x2002) {
          if (uVar3 <= *(int *)(this_00 + lVar16 + 0x44) - 0x100U) {
            return 0x1e;
          }
          ppVVar14 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                               ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                                &(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].
                                 super_BaseEmitter._code,
                                (ulong)(*(int *)(this_00 + lVar16 + 0x44) - 0x100U));
          if (*(long *)(*ppVVar14 + 0x28) == 0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                       ,0x58f,"workReg != nullptr");
          }
          pbVar6 = *(byte **)(*(long *)(*ppVVar14 + 0x28) + 0x18);
          iVar10 = *(int *)(pbVar6 + 0x10);
          uVar4 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature._bits;
          *(uint *)(this_00 + lVar16 + 0x44) = (uint)*pbVar6;
          *(uint *)(this_00 + lVar16 + 0x40) =
               *(uint *)(this_00 + lVar16 + 0x40) & 0xffffdf07 | uVar4 & 0xf8;
          *(int *)(this_00 + lVar16 + 0x4c) = *(int *)(this_00 + lVar16 + 0x4c) + iVar10;
        }
      }
    }
    *(undefined8 *)(this_00 + 0x20) = 0;
    uVar4 = *(uint *)(plVar5 + 2);
    uVar20 = 0;
    for (uVar18 = 0; uVar18 != uVar4; uVar18 = uVar18 + 1) {
      lVar16 = uVar18 * 0x20;
      _useIt = *(int *)((long)plVar5 + lVar16 + 100);
      bVar2 = *(byte *)((long)plVar5 + lVar16 + 0x5a);
      while (_useIt != 0) {
        if (uVar20 <= bVar2) {
          uVar20 = (uint)bVar2;
        }
        uVar9 = Support::BitWordIterator<unsigned_int>::next(&useIt);
        InstNode::rewriteIdAtIndex(this_00,uVar9,(uint)bVar2);
      }
      _outIt = (int)plVar5[uVar18 * 4 + 0xd];
      bVar2 = *(byte *)((long)plVar5 + lVar16 + 0x5b);
      while (_outIt != 0) {
        if (uVar20 <= bVar2) {
          uVar20 = (uint)bVar2;
        }
        uVar9 = Support::BitWordIterator<unsigned_int>::next(&outIt);
        InstNode::rewriteIdAtIndex(this_00,uVar9,(uint)bVar2);
      }
    }
    uVar4 = *(uint *)((long)plVar5 + 0xc);
    if ((uVar4 >> 0x1e & 1) != 0) {
      iVar10 = *(int *)(this_00 + 0x30);
      if (iVar10 == 0x4c8) {
        if (((*(uint *)(this_00 + 0x40) & 0xf07) == 1) &&
           (uVar15 = *(uint *)(this_00 + 0x50), (uVar15 & 7) == 2)) {
          uVar17 = 0x1de;
          uVar19 = 0x2000000;
          goto LAB_00145540;
        }
      }
      else if (iVar10 == 0x166) {
LAB_001454c0:
        if (((*(uint *)(this_00 + 0x40) & 0xf07) == 1) &&
           (uVar15 = *(uint *)(this_00 + 0x50), (uVar15 & 7) == 2)) {
          uVar17 = 0x1b7;
          uVar19 = 0x4000000;
          goto LAB_00145540;
        }
      }
      else {
        if (iVar10 != 0x167) {
          if (iVar10 == 0x1bc) goto LAB_001454c0;
          if (iVar10 != 0x1d3) {
            if (iVar10 == 0x4aa) goto LAB_001454c0;
            if (iVar10 != 0x4c0) {
              if (((iVar10 == 0x165) && ((*(uint *)(this_00 + 0x40) & 0xf07) == 1)) &&
                 (uVar15 = *(uint *)(this_00 + 0x50), (uVar15 & 7) == 2)) {
                uVar17 = 0x1de;
                uVar19 = 0x1000000;
                goto LAB_00145540;
              }
              goto LAB_00145345;
            }
          }
        }
        if (((*(uint *)(this_00 + 0x40) & 0xf07) == 1) &&
           (uVar15 = *(uint *)(this_00 + 0x50), (uVar15 & 7) == 2)) {
          uVar17 = 0x1b7;
          uVar19 = 0x8000000;
LAB_00145540:
          *(uint *)(this_00 + 0x50) = uVar15 & 0xfffffa | uVar19;
          *(undefined4 *)(this_00 + 0x30) = uVar17;
        }
      }
    }
LAB_00145345:
    if (((int)uVar4 < 0) && (0xf < uVar20)) {
      iVar10 = *(int *)(this_00 + 0x30);
      switch(iVar10) {
      case 0x64e:
        uVar17 = 0x648;
        break;
      case 0x64f:
        uVar17 = 0x64a;
        break;
      case 0x650:
        uVar17 = 0x64b;
        break;
      case 0x651:
        uVar17 = 0x64d;
        break;
      default:
        if (iVar10 == 0x35e) {
          uVar17 = 0x360;
        }
        else if (iVar10 == 0x62f) {
          uVar17 = 0x630;
        }
        else if (iVar10 == 0x3d7) {
          uVar17 = 0x3d8;
        }
        else if (iVar10 == 0x3dc) {
          uVar17 = 0x3dd;
        }
        else if (iVar10 == 0x485) {
          uVar17 = 0x486;
        }
        else if (iVar10 == 0x48a) {
          uVar17 = 0x48b;
        }
        else if (iVar10 == 0x4ac) {
          uVar17 = 0x4ad;
        }
        else if (iVar10 == 0x4af) {
          uVar17 = 0x4b1;
        }
        else if (iVar10 == 0x4f0) {
          uVar17 = 0x4f1;
        }
        else if (iVar10 == 0x4f2) {
          uVar17 = 0x4f3;
        }
        else if (iVar10 == 0x5cf) {
          uVar17 = 0x5d0;
        }
        else {
          if (iVar10 != 0x364) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                       ,0x4fc,"false");
          }
          uVar17 = 0x366;
        }
      }
      *(undefined4 *)(this_00 + 0x30) = uVar17;
    }
    if ((((*(byte *)(plVar5 + 1) & 1) == 0) || (*(int *)(this_00 + 0x38) != 0)) ||
       (this_00[0x12] != (InstNode)0x2)) {
LAB_00145608:
      if (this_00[0x10] == (InstNode)0x11) {
        lVar16 = *plVar5;
        bVar8 = BaseRAPass::isNextTo
                          (&this->super_BaseRAPass,(BaseNode *)this_00,
                           (BaseNode *)((this->super_BaseRAPass)._func)->_exitNode);
        if (!bVar8) {
          ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor = *(BaseNode **)this_00;
          _useIt = 5;
          EVar11 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                             (this,&useIt);
          if (EVar11 != 0) {
            return EVar11;
          }
        }
        uVar7 = *(undefined8 *)this_00;
        BaseBuilder::removeNode
                  ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,(BaseNode *)this_00);
        *(undefined8 *)(lVar16 + 0x18) = uVar7;
      }
      goto LAB_0014561e;
    }
    pOVar12 = InstNode::op(this_00,0);
    pOVar13 = InstNode::op(this_00,1);
    auVar21._0_4_ =
         -(uint)((pOVar13->super_Operand_)._signature._bits ==
                (pOVar12->super_Operand_)._signature._bits);
    auVar21._4_4_ = -(uint)((pOVar13->super_Operand_)._baseId == (pOVar12->super_Operand_)._baseId);
    auVar21._8_4_ =
         -(uint)((pOVar13->super_Operand_)._data[0] == (pOVar12->super_Operand_)._data[0]);
    auVar21._12_4_ =
         -(uint)((pOVar13->super_Operand_)._data[1] == (pOVar12->super_Operand_)._data[1]);
    iVar10 = movmskps((int)pOVar13,auVar21);
    if (iVar10 != 0xf) goto LAB_00145608;
    BaseBuilder::removeNode
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,(BaseNode *)this_00);
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // If one operand was rewritten from Reg to Mem, we have to ensure that we are using the correct instruction.
        if (raInst->isRegToMemPatched()) {
          switch (inst->id()) {
            case Inst::kIdKmovb: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(1);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdVmovw: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(2);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdMovd:
            case Inst::kIdVmovd:
            case Inst::kIdKmovd: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(4);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            case Inst::kIdMovq:
            case Inst::kIdVmovq:
            case Inst::kIdKmovq: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVQ to MOV.
                operands[1].as<Mem>().setSize(8);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            default:
              break;
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}